

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem markbeingfnz(global_State *g)

{
  lu_mem local_20;
  lu_mem count;
  GCObject *o;
  global_State *g_local;
  
  local_20 = 0;
  count = (lu_mem)g->tobefnz;
  do {
    if (count == 0) {
      return local_20;
    }
    local_20 = local_20 + 1;
    if ((*(byte *)(count + 9) & 0x18) != 0) {
      if (9 < (*(byte *)(count + 8) & 0xf)) {
        __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x1b9,"lu_mem markbeingfnz(global_State *)");
      }
      reallymarkobject(g,(GCObject *)count);
    }
    count = *(lu_mem *)count;
  } while( true );
}

Assistant:

static lu_mem markbeingfnz (global_State *g) {
  GCObject *o;
  lu_mem count = 0;
  for (o = g->tobefnz; o != NULL; o = o->next) {
    count++;
    markobject(g, o);
  }
  return count;
}